

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O1

void comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst,QRgbaFloat32 *src,int length,uint const_alpha)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  QRgbaFloat32 *pQVar4;
  QRgbaFloat32 *pQVar5;
  QRgbaFloat32 *pQVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ulong uVar20;
  long lVar21;
  float fVar22;
  float in_register_0000129c;
  float in_register_000012dc;
  
  if (const_alpha == 0xff) {
    memcpy(dst,src,(long)length << 4);
    return;
  }
  fVar22 = (float)const_alpha / 255.0;
  fVar7 = 1.0 - fVar22;
  uVar20 = 0;
  if (1 < length) {
    lVar21 = 0;
    uVar20 = 0;
    do {
      pfVar1 = (float *)((long)&src->r + lVar21);
      fVar8 = pfVar1[1];
      fVar9 = pfVar1[2];
      fVar10 = pfVar1[3];
      fVar11 = pfVar1[4];
      fVar12 = pfVar1[5];
      fVar13 = pfVar1[6];
      pfVar2 = (float *)((long)&dst->r + lVar21);
      fVar14 = pfVar2[1];
      fVar15 = pfVar2[2];
      fVar16 = pfVar2[3];
      fVar17 = pfVar2[4];
      fVar18 = pfVar2[5];
      fVar19 = pfVar2[6];
      in_register_0000129c = in_register_0000129c + in_register_000012dc;
      pfVar3 = (float *)((long)&dst->r + lVar21);
      *pfVar3 = fVar22 * *pfVar1 + fVar7 * *pfVar2;
      pfVar3[1] = fVar22 * fVar8 + fVar7 * fVar14;
      pfVar3[2] = fVar22 * fVar9 + fVar7 * fVar15;
      pfVar3[3] = fVar22 * fVar10 + fVar7 * fVar16;
      pfVar3[4] = fVar22 * fVar11 + fVar7 * fVar17;
      pfVar3[5] = fVar22 * fVar12 + fVar7 * fVar18;
      pfVar3[6] = fVar22 * fVar13 + fVar7 * fVar19;
      pfVar3[7] = in_register_0000129c;
      uVar20 = uVar20 + 2;
      lVar21 = lVar21 + 0x20;
    } while ((long)uVar20 < (long)(length + -1));
  }
  if ((int)uVar20 < length) {
    uVar20 = uVar20 & 0xffffffff;
    pQVar4 = src + uVar20;
    fVar8 = pQVar4->g;
    fVar9 = pQVar4->b;
    fVar10 = pQVar4->a;
    pQVar5 = dst + uVar20;
    pQVar6 = dst + uVar20;
    pQVar6->r = fVar22 * pQVar4->r + fVar7 * pQVar5->r;
    pQVar6->g = fVar22 * fVar8 + fVar7 * pQVar5->g;
    pQVar6->b = fVar22 * fVar9 + fVar7 * pQVar5->b;
    pQVar6->a = fVar22 * fVar10 + fVar7 * pQVar5->a;
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst, const QRgbaFloat32 *src, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        ::memcpy(dst, src, length * sizeof(QRgbaFloat32));
    } else {
        const float ca = const_alpha / 255.f;
        const float cia = 1.0f - ca;

        const __m128 constAlphaVector = _mm_set1_ps(ca);
        const __m128 oneMinusConstAlpha =  _mm_set1_ps(cia);
        const __m256 constAlphaVector256 = _mm256_set1_ps(ca);
        const __m256 oneMinusConstAlpha256 =  _mm256_set1_ps(cia);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 srcVector = _mm256_loadu_ps((const float *)&src[x]);
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            srcVector = _mm256_mul_ps(srcVector, constAlphaVector256);
            dstVector = _mm256_mul_ps(dstVector, oneMinusConstAlpha256);
            dstVector = _mm256_add_ps(dstVector, srcVector);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 srcVector = _mm_loadu_ps((const float *)&src[x]);
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            srcVector = _mm_mul_ps(srcVector, constAlphaVector);
            dstVector = _mm_mul_ps(dstVector, oneMinusConstAlpha);
            dstVector = _mm_add_ps(dstVector, srcVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}